

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmartPtr.hpp
# Opt level: O1

SmartPtr<Lib::SubscriptionObject> * __thiscall
Lib::SmartPtr<Lib::SubscriptionObject>::operator=
          (SmartPtr<Lib::SubscriptionObject> *this,SmartPtr<Lib::SubscriptionObject> *ptr)

{
  SubscriptionObject *this_00;
  RefCounter *pRVar1;
  SubscriptionObject *pSVar2;
  RefCounter *pRVar3;
  void **head;
  
  this_00 = this->_obj;
  pRVar1 = this->_refCnt;
  pSVar2 = ptr->_obj;
  this->_obj = pSVar2;
  pRVar3 = ptr->_refCnt;
  this->_refCnt = pRVar3;
  if (pRVar3 != (RefCounter *)0x0 && pSVar2 != (SubscriptionObject *)0x0) {
    pRVar3->_val = pRVar3->_val + 1;
  }
  if ((pRVar1 != (RefCounter *)0x0 && this_00 != (SubscriptionObject *)0x0) &&
     (pRVar1->_val = pRVar1->_val + -1, pRVar1->_val == 0)) {
    SubscriptionObject::~SubscriptionObject(this_00);
    operator_delete(this_00,0x10);
    *(undefined8 *)pRVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar1;
  }
  return this;
}

Assistant:

SmartPtr& operator=(const SmartPtr& ptr)
  {
    T* oldObj=_obj;
    RefCounter* oldCnt=_refCnt;
    _obj=ptr._obj;
    _refCnt=ptr._refCnt;

    if(_obj && _refCnt) {
      (_refCnt->_val)++;
    }

    if(oldObj && oldCnt) {
      (oldCnt->_val)--;
      ASS(oldCnt->_val >= 0);
      if(! oldCnt->_val) {
        checked_delete(oldObj);
        delete oldCnt;
      }
    }
    return *this;
  }